

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O0

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::handleIndexArrayNode
          (OpenGEXImporter *this,DDLNode *node,aiScene *param_2)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  bool bVar7;
  float fVar8;
  bool bVar9;
  uint32 uVar10;
  DeadlyImportError *pDVar11;
  size_t sVar12;
  ulong uVar13;
  size_t *psVar14;
  aiVector3D *paVar15;
  aiColor4D *paVar16;
  uint *puVar17;
  size_type sVar18;
  reference pvVar19;
  aiFace *paVar20;
  aiColor4D *paVar21;
  ulong uVar22;
  aiVector3t<float> *local_1c0;
  aiVector3t<float> *local_198;
  aiColor4t<float> *local_170;
  aiVector3t<float> *local_148;
  aiFace *local_120;
  aiVector3D *tex;
  aiVector3D *normal;
  aiColor4D *col;
  aiVector3D *pos;
  ulong uStack_b8;
  int idx;
  size_t indices;
  Value *next;
  aiFace *current;
  size_t i;
  uint index;
  bool hasTexCoords;
  bool hasNormalCoords;
  bool hasColors;
  size_t numItems;
  DataArrayList *vaList;
  string local_78;
  undefined1 local_55;
  allocator local_41;
  string local_40;
  aiScene *local_20;
  aiScene *param_2_local;
  DDLNode *node_local;
  OpenGEXImporter *this_local;
  
  local_20 = param_2;
  param_2_local = (aiScene *)node;
  node_local = (DDLNode *)this;
  if (node == (DDLNode *)0x0) {
    local_55 = 1;
    pDVar11 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,"No parent node for name.",&local_41);
    DeadlyImportError::DeadlyImportError(pDVar11,&local_40);
    local_55 = 0;
    __cxa_throw(pDVar11,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  if (this->m_currentMesh == (aiMesh *)0x0) {
    vaList._6_1_ = 1;
    pDVar11 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_78,"No current mesh for index data found.",
               (allocator *)((long)&vaList + 7));
    DeadlyImportError::DeadlyImportError(pDVar11,&local_78);
    vaList._6_1_ = 0;
    __cxa_throw(pDVar11,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  numItems = (size_t)ODDLParser::DDLNode::getDataArrayList(node);
  if ((DataArrayList *)numItems != (DataArrayList *)0x0) {
    sVar12 = countDataArrayListItems((DataArrayList *)numItems);
    this->m_currentMesh->mNumFaces = (uint)sVar12;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = sVar12;
    uVar13 = SUB168(auVar1 * ZEXT816(0x10),0);
    uVar22 = uVar13 + 8;
    if (SUB168(auVar1 * ZEXT816(0x10),8) != 0 || 0xfffffffffffffff7 < uVar13) {
      uVar22 = 0xffffffffffffffff;
    }
    psVar14 = (size_t *)operator_new__(uVar22);
    *psVar14 = sVar12;
    paVar20 = (aiFace *)(psVar14 + 1);
    if (sVar12 != 0) {
      local_120 = paVar20;
      do {
        aiFace::aiFace(local_120);
        local_120 = local_120 + 1;
      } while (local_120 != paVar20 + sVar12);
    }
    this->m_currentMesh->mFaces = paVar20;
    this->m_currentMesh->mNumVertices = (uint)sVar12 * 3;
    uVar13 = CONCAT44(0,this->m_currentMesh->mNumVertices);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar13;
    uVar22 = SUB168(auVar2 * ZEXT816(0xc),0);
    if (SUB168(auVar2 * ZEXT816(0xc),8) != 0) {
      uVar22 = 0xffffffffffffffff;
    }
    paVar15 = (aiVector3D *)operator_new__(uVar22);
    if (uVar13 != 0) {
      local_148 = paVar15;
      do {
        aiVector3t<float>::aiVector3t(local_148);
        local_148 = local_148 + 1;
      } while (local_148 != paVar15 + uVar13);
    }
    this->m_currentMesh->mVertices = paVar15;
    bVar6 = false;
    if ((this->m_currentVertices).m_numColors != 0) {
      uVar13 = (this->m_currentVertices).m_numColors;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar13;
      uVar22 = SUB168(auVar3 * ZEXT816(0x10),0);
      if (SUB168(auVar3 * ZEXT816(0x10),8) != 0) {
        uVar22 = 0xffffffffffffffff;
      }
      paVar16 = (aiColor4D *)operator_new__(uVar22);
      if (uVar13 != 0) {
        local_170 = paVar16;
        do {
          aiColor4t<float>::aiColor4t(local_170);
          local_170 = local_170 + 1;
        } while (local_170 != paVar16 + uVar13);
      }
      this->m_currentMesh->mColors[0] = paVar16;
      bVar6 = true;
    }
    bVar7 = false;
    bVar9 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::empty
                      (&(this->m_currentVertices).m_normals);
    if (!bVar9) {
      uVar13 = CONCAT44(0,this->m_currentMesh->mNumVertices);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar13;
      uVar22 = SUB168(auVar4 * ZEXT816(0xc),0);
      if (SUB168(auVar4 * ZEXT816(0xc),8) != 0) {
        uVar22 = 0xffffffffffffffff;
      }
      paVar15 = (aiVector3D *)operator_new__(uVar22);
      if (uVar13 != 0) {
        local_198 = paVar15;
        do {
          aiVector3t<float>::aiVector3t(local_198);
          local_198 = local_198 + 1;
        } while (local_198 != paVar15 + uVar13);
      }
      this->m_currentMesh->mNormals = paVar15;
      bVar7 = true;
    }
    bVar9 = false;
    if ((this->m_currentVertices).m_numUVComps[0] != 0) {
      uVar13 = CONCAT44(0,this->m_currentMesh->mNumVertices);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar13;
      uVar22 = SUB168(auVar5 * ZEXT816(0xc),0);
      if (SUB168(auVar5 * ZEXT816(0xc),8) != 0) {
        uVar22 = 0xffffffffffffffff;
      }
      paVar15 = (aiVector3D *)operator_new__(uVar22);
      if (uVar13 != 0) {
        local_1c0 = paVar15;
        do {
          aiVector3t<float>::aiVector3t(local_1c0);
          local_1c0 = local_1c0 + 1;
        } while (local_1c0 != paVar15 + uVar13);
      }
      this->m_currentMesh->mTextureCoords[0] = paVar15;
      bVar9 = true;
    }
    i._0_4_ = 0;
    for (current = (aiFace *)0x0; current < (aiFace *)(ulong)this->m_currentMesh->mNumFaces;
        current = (aiFace *)((long)&current->mNumIndices + 1)) {
      paVar20 = this->m_currentMesh->mFaces + (long)current;
      paVar20->mNumIndices = 3;
      auVar1 = ZEXT416(paVar20->mNumIndices) * ZEXT816(4);
      uVar13 = auVar1._0_8_;
      if (auVar1._8_8_ != 0) {
        uVar13 = 0xffffffffffffffff;
      }
      puVar17 = (uint *)operator_new__(uVar13);
      paVar20->mIndices = puVar17;
      indices = *(size_t *)(numItems + 8);
      for (uStack_b8 = 0; uStack_b8 < paVar20->mNumIndices; uStack_b8 = uStack_b8 + 1) {
        uVar10 = ODDLParser::Value::getUnsignedInt32((Value *)indices);
        sVar18 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                           (&(this->m_currentVertices).m_vertices);
        if (sVar18 < (ulong)(long)(int)uVar10) {
          __assert_fail("static_cast<size_t>( idx ) <= m_currentVertices.m_vertices.size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/OpenGEX/OpenGEXImporter.cpp"
                        ,0x3a4,
                        "void Assimp::OpenGEX::OpenGEXImporter::handleIndexArrayNode(ODDLParser::DDLNode *, aiScene *)"
                       );
        }
        if (this->m_currentMesh->mNumVertices <= (uint)i) {
          __assert_fail("index < m_currentMesh->mNumVertices",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/OpenGEX/OpenGEXImporter.cpp"
                        ,0x3a5,
                        "void Assimp::OpenGEX::OpenGEXImporter::handleIndexArrayNode(ODDLParser::DDLNode *, aiScene *)"
                       );
        }
        pvVar19 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                            (&(this->m_currentVertices).m_vertices,(long)(int)uVar10);
        aiVector3t<float>::Set
                  (this->m_currentMesh->mVertices + (uint)i,pvVar19->x,pvVar19->y,pvVar19->z);
        if (bVar6) {
          paVar21 = (this->m_currentVertices).m_colors + (int)uVar10;
          paVar16 = this->m_currentMesh->mColors[0] + (uint)i;
          fVar8 = paVar21->g;
          paVar16->r = paVar21->r;
          paVar16->g = fVar8;
          fVar8 = paVar21->a;
          paVar16->b = paVar21->b;
          paVar16->a = fVar8;
        }
        if (bVar7) {
          pvVar19 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                              (&(this->m_currentVertices).m_normals,(long)(int)uVar10);
          aiVector3t<float>::Set
                    (this->m_currentMesh->mNormals + (uint)i,pvVar19->x,pvVar19->y,pvVar19->z);
        }
        if (bVar9) {
          paVar15 = (this->m_currentVertices).m_textureCoords[0] + (int)uVar10;
          aiVector3t<float>::Set
                    (this->m_currentMesh->mTextureCoords[0] + (uint)i,paVar15->x,paVar15->y,
                     paVar15->z);
        }
        paVar20->mIndices[uStack_b8] = (uint)i;
        i._0_4_ = (uint)i + 1;
        indices = *(size_t *)(indices + 0x18);
      }
      numItems = *(size_t *)(numItems + 0x10);
    }
  }
  return;
}

Assistant:

void OpenGEXImporter::handleIndexArrayNode( ODDLParser::DDLNode *node, aiScene * /*pScene*/ ) {
    if( nullptr == node ) {
        throw DeadlyImportError( "No parent node for name." );
        return;
    }

    if( nullptr == m_currentMesh ) {
        throw DeadlyImportError( "No current mesh for index data found." );
        return;
    }

    DataArrayList *vaList = node->getDataArrayList();
    if( nullptr == vaList ) {
        return;
    }

    const size_t numItems( countDataArrayListItems( vaList ) );
    m_currentMesh->mNumFaces = static_cast<unsigned int>(numItems);
    m_currentMesh->mFaces = new aiFace[ numItems ];
    m_currentMesh->mNumVertices = static_cast<unsigned int>(numItems * 3);
    m_currentMesh->mVertices = new aiVector3D[ m_currentMesh->mNumVertices ];
    bool hasColors( false );
    if ( m_currentVertices.m_numColors > 0 ) {
        m_currentMesh->mColors[0] = new aiColor4D[ m_currentVertices.m_numColors ];
        hasColors = true;
    }
    bool hasNormalCoords( false );
    if ( !m_currentVertices.m_normals.empty() ) {
        m_currentMesh->mNormals = new aiVector3D[ m_currentMesh->mNumVertices ];
        hasNormalCoords = true;
    }
    bool hasTexCoords( false );
    if ( m_currentVertices.m_numUVComps[ 0 ] > 0 ) {
        m_currentMesh->mTextureCoords[ 0 ] = new aiVector3D[ m_currentMesh->mNumVertices ];
        hasTexCoords = true;
    }

    unsigned int index( 0 );
    for( size_t i = 0; i < m_currentMesh->mNumFaces; i++ ) {
        aiFace &current(  m_currentMesh->mFaces[ i ] );
        current.mNumIndices = 3;
        current.mIndices = new unsigned int[ current.mNumIndices ];
        Value *next( vaList->m_dataList );
        for( size_t indices = 0; indices < current.mNumIndices; indices++ ) {
            const int idx( next->getUnsignedInt32() );
            ai_assert( static_cast<size_t>( idx ) <= m_currentVertices.m_vertices.size() );
            ai_assert( index < m_currentMesh->mNumVertices );
            aiVector3D &pos = ( m_currentVertices.m_vertices[ idx ] );
            m_currentMesh->mVertices[ index ].Set( pos.x, pos.y, pos.z );
            if ( hasColors ) {
                aiColor4D &col = m_currentVertices.m_colors[ idx ];
                m_currentMesh->mColors[ 0 ][ index ] = col;
            }
            if ( hasNormalCoords ) {
                aiVector3D &normal = ( m_currentVertices.m_normals[ idx ] );
                m_currentMesh->mNormals[ index ].Set( normal.x, normal.y, normal.z );
            }
            if ( hasTexCoords ) {
                aiVector3D &tex = ( m_currentVertices.m_textureCoords[ 0 ][ idx ] );
                m_currentMesh->mTextureCoords[ 0 ][ index ].Set( tex.x, tex.y, tex.z );
            }
            current.mIndices[ indices ] = index;
            index++;

            next = next->m_next;
        }
        vaList = vaList->m_next;
    }
}